

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

void train_one(problem *prob,parameter *param,double *w,double Cp,double Cn)

{
  undefined4 uVar1;
  int iVar2;
  double *pdVar3;
  int *piVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  int iVar7;
  double *pdVar8;
  l2r_l2_svr_fun *this;
  l2r_l2_svc_fun *this_00;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *__src;
  void *__s;
  void *__dest;
  void *pvVar12;
  long lVar13;
  feature_node *pfVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  feature_node *pfVar19;
  ulong uVar20;
  int t_2;
  int iVar21;
  uint uVar22;
  void *pvVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  void *pvVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined4 uVar31;
  undefined4 uVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  TRON tron_obj;
  feature_node *x_space;
  double local_1e8;
  double local_1b0;
  double local_1a8;
  double local_188;
  uint local_174;
  uint local_14c;
  double local_130 [2];
  undefined1 local_120 [40];
  double local_f8;
  undefined8 uStack_f0;
  void *local_e0;
  void *local_d8;
  size_t local_d0;
  double local_c8;
  void *local_c0;
  void *local_b8;
  feature_node *local_b0;
  double local_a8;
  double local_98;
  ulong local_80;
  double local_78;
  void *local_70;
  double local_68;
  undefined8 uStack_60;
  size_t local_50;
  double local_48;
  undefined8 uStack_40;
  
  iVar7 = prob->l;
  lVar24 = (long)iVar7;
  if (lVar24 < 1) {
    iVar21 = 0;
  }
  else {
    lVar18 = 0;
    iVar21 = 0;
    do {
      iVar21 = iVar21 + (uint)(0.0 < prob->y[lVar18]);
      lVar18 = lVar18 + 1;
    } while (lVar24 != lVar18);
  }
  iVar26 = iVar7 - iVar21;
  if (iVar21 < iVar7 - iVar21) {
    iVar26 = iVar21;
  }
  iVar21 = 1;
  if (1 < iVar26) {
    iVar21 = iVar26;
  }
  if (0xd < (uint)param->solver_type) {
switchD_001062a2_caseD_4:
    train_one();
    return;
  }
  dVar35 = param->eps;
  dVar29 = *(double *)(&DAT_0010b0d0 + (ulong)(param->init_sol == (double *)0x0) * 8);
  dVar33 = ((double)iVar21 * dVar35) / (double)iVar7;
  local_a8 = Cn;
  local_98 = Cp;
  switch(param->solver_type) {
  case 0:
    uVar20 = 0xffffffffffffffff;
    if (-1 < iVar7) {
      uVar20 = lVar24 << 3;
    }
    pdVar8 = (double *)operator_new__(uVar20);
    if (0 < iVar7) {
      pdVar3 = prob->y;
      lVar18 = 0;
      do {
        uVar20 = -(ulong)(0.0 < pdVar3[lVar18]);
        pdVar8[lVar18] = (double)(~uVar20 & (ulong)local_a8 | uVar20 & (ulong)local_98);
        lVar18 = lVar18 + 1;
      } while (lVar24 != lVar18);
    }
    this_00 = (l2r_l2_svc_fun *)operator_new(0x30);
    l2r_lr_fun::l2r_lr_fun((l2r_lr_fun *)this_00,prob,pdVar8);
    TRON::TRON((TRON *)local_120,(function *)this_00,dVar33,dVar29,1000);
    TRON::set_print_string((TRON *)local_120,liblinear_print_string);
    TRON::tron((TRON *)local_120,w);
    break;
  case 1:
    iVar7 = 1;
    goto LAB_00106ec9;
  case 2:
    uVar20 = 0xffffffffffffffff;
    if (-1 < iVar7) {
      uVar20 = lVar24 << 3;
    }
    pdVar8 = (double *)operator_new__(uVar20);
    if (0 < iVar7) {
      pdVar3 = prob->y;
      lVar18 = 0;
      do {
        uVar20 = -(ulong)(0.0 < pdVar3[lVar18]);
        pdVar8[lVar18] = (double)(~uVar20 & (ulong)local_a8 | uVar20 & (ulong)local_98);
        lVar18 = lVar18 + 1;
      } while (lVar24 != lVar18);
    }
    this_00 = (l2r_l2_svc_fun *)operator_new(0x40);
    l2r_l2_svc_fun::l2r_l2_svc_fun(this_00,prob,pdVar8);
    TRON::TRON((TRON *)local_120,(function *)this_00,dVar33,dVar29,1000);
    TRON::set_print_string((TRON *)local_120,liblinear_print_string);
    TRON::tron((TRON *)local_120,w);
    break;
  case 3:
    iVar7 = 3;
LAB_00106ec9:
    solve_l2r_l1l2_svc(prob,w,dVar35,Cp,Cn,iVar7);
    return;
  default:
    goto switchD_001062a2_caseD_4;
  case 5:
    local_b0 = (feature_node *)0x0;
    transpose(prob,&local_b0,(problem *)local_120);
    uVar27 = (ulong)(int)local_120._0_4_;
    lVar24 = (long)(int)local_120._4_4_;
    uVar20 = lVar24 * 4;
    local_1e8 = (double)(lVar24 * 8);
    dVar35 = local_1e8;
    if (lVar24 < 0) {
      uVar20 = 0xffffffffffffffff;
      dVar35 = -NAN;
    }
    pvVar9 = operator_new__(uVar20);
    pvVar10 = operator_new__(uVar27);
    uVar20 = uVar27 * 8;
    if ((long)uVar27 < 0) {
      uVar20 = 0xffffffffffffffff;
    }
    pvVar11 = operator_new__(uVar20);
    pvVar12 = operator_new__((ulong)dVar35);
    uVar20 = (ulong)(uint)local_120._0_4_;
    local_130[0] = 0.0;
    local_130[1] = local_98;
    if (0 < lVar24) {
      memset(w,0,(size_t)local_1e8);
    }
    uVar5 = local_120._16_8_;
    if (0 < (int)local_120._0_4_) {
      uVar27 = 0;
      do {
        *(undefined8 *)((long)pvVar11 + uVar27 * 8) = 0x3ff0000000000000;
        *(byte *)((long)pvVar10 + uVar27) = -(*(double *)(local_120._8_8_ + uVar27 * 8) <= 0.0) | 1;
        uVar27 = uVar27 + 1;
      } while (uVar20 != uVar27);
    }
    if (0 < (int)local_120._4_4_) {
      lVar18 = 0;
      do {
        *(int *)((long)pvVar9 + lVar18 * 4) = (int)lVar18;
        *(undefined8 *)((long)pvVar12 + lVar18 * 8) = 0;
        iVar7 = (*(feature_node **)(local_120._16_8_ + lVar18 * 8))->index;
        if (iVar7 != -1) {
          pdVar8 = &(*(feature_node **)(local_120._16_8_ + lVar18 * 8))->value;
          do {
            lVar13 = (long)iVar7;
            dVar35 = (double)(int)*(char *)((long)pvVar10 + lVar13 + -1) * *pdVar8;
            *pdVar8 = dVar35;
            *(double *)((long)pvVar11 + lVar13 * 8 + -8) =
                 *(double *)((long)pvVar11 + lVar13 * 8 + -8) - w[lVar18] * dVar35;
            *(double *)((long)pvVar12 + lVar18 * 8) =
                 local_130[*(char *)((long)pvVar10 + lVar13 + -1)] * dVar35 * dVar35 +
                 *(double *)((long)pvVar12 + lVar18 * 8);
            iVar7 = *(int *)(pdVar8 + 1);
            pdVar8 = pdVar8 + 2;
          } while (iVar7 != -1);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != lVar24);
    }
    local_68 = (double)(int)local_120._0_4_;
    uVar31 = 0;
    uVar32 = 0xbff00000;
    dVar35 = INFINITY;
    uVar27 = (ulong)(uint)local_120._4_4_;
    uVar22 = 0;
    do {
      if ((int)uVar27 < 1) {
        dVar29 = 0.0;
        dVar35 = 0.0;
      }
      else {
        lVar18 = 0;
        uVar16 = uVar27;
        do {
          iVar7 = rand();
          lVar13 = iVar7 % (int)uVar16 + lVar18;
          uVar1 = *(undefined4 *)((long)pvVar9 + lVar13 * 4);
          *(undefined4 *)((long)pvVar9 + lVar13 * 4) = *(undefined4 *)((long)pvVar9 + lVar18 * 4);
          *(undefined4 *)((long)pvVar9 + lVar18 * 4) = uVar1;
          lVar18 = lVar18 + 1;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
        if (0 < (int)uVar27) {
          local_f8 = dVar35 / local_68;
          uStack_f0 = 0;
          dVar34 = -dVar35 / local_68;
          dVar35 = 0.0;
          iVar7 = 0;
          dVar29 = 0.0;
LAB_00106635:
          iVar15 = (int)uVar27;
          iVar21 = *(int *)((long)pvVar9 + (long)iVar7 * 4);
          lVar18 = (long)iVar21;
          pfVar14 = *(feature_node **)(uVar5 + lVar18 * 8);
          iVar2 = pfVar14->index;
          dVar39 = 0.0;
          dVar40 = 0.0;
          iVar26 = iVar2;
          pfVar19 = pfVar14;
          if (iVar2 != -1) {
            do {
              dVar37 = *(double *)((long)pvVar11 + (long)iVar26 * 8 + -8);
              if (0.0 < dVar37) {
                dVar36 = local_130[*(char *)((long)pvVar10 + (long)iVar26 + -1)] * pfVar19->value;
                dVar40 = dVar40 - dVar37 * dVar36;
                dVar39 = dVar39 + dVar36 * pfVar19->value;
              }
              iVar26 = pfVar19[1].index;
              pfVar19 = pfVar19 + 1;
            } while (iVar26 != -1);
            dVar40 = dVar40 + dVar40;
            dVar39 = dVar39 + dVar39;
          }
          if (dVar39 <= 1e-12) {
            dVar39 = 1e-12;
          }
          dVar41 = dVar40 + 1.0;
          dVar36 = dVar40 + -1.0;
          dVar37 = w[lVar18];
          if ((dVar37 != 0.0) || (NAN(dVar37))) {
            dVar38 = dVar36;
            if (0.0 < dVar37) {
              dVar38 = dVar41;
            }
            dVar38 = ABS(dVar38);
LAB_0010674a:
            if (dVar39 * dVar37 <= dVar41) {
              if (dVar36 <= dVar39 * dVar37) {
                dVar39 = -dVar37;
              }
              else {
                dVar39 = -dVar36 / dVar39;
              }
            }
            else {
              dVar39 = -dVar41 / dVar39;
            }
            if (dVar35 <= dVar38) {
              dVar35 = dVar38;
            }
            dVar29 = dVar29 + dVar38;
            if (ABS(dVar39) < 1e-12) goto LAB_00106b1b;
            dVar38 = dVar40 * dVar39 + (ABS(dVar37 + dVar39) - ABS(dVar37));
            dVar36 = *(double *)((long)pvVar12 + lVar18 * 8);
            pfVar14 = pfVar14 + 1;
            uVar17 = 0;
            dVar41 = 0.0;
            do {
              dVar41 = dVar41 - dVar39;
              dVar42 = dVar38 * -0.01 + (ABS(dVar37 + dVar39) - ABS(dVar37));
              if (dVar36 * dVar39 * dVar39 + dVar40 * dVar39 + dVar42 <= 0.0)
              goto joined_r0x001069b4;
              dVar43 = 0.0;
              iVar21 = iVar2;
              pfVar19 = pfVar14;
              if (uVar17 == 0) {
                if (iVar2 == -1) {
                  local_1e8 = 0.0;
                }
                else {
                  local_1e8 = 0.0;
                  do {
                    lVar13 = (long)iVar21;
                    dVar44 = *(double *)((long)pvVar11 + lVar13 * 8 + -8);
                    if (0.0 < dVar44) {
                      local_1e8 = local_1e8 +
                                  local_130[*(char *)((long)pvVar10 + lVar13 + -1)] * dVar44 *
                                  dVar44;
                    }
                    dVar44 = pfVar19[-1].value * dVar41 + dVar44;
                    *(double *)((long)pvVar11 + lVar13 * 8 + -8) = dVar44;
                    if (0.0 < dVar44) {
                      dVar43 = dVar43 + local_130[*(char *)((long)pvVar10 + lVar13 + -1)] * dVar44 *
                                        dVar44;
                    }
                    iVar21 = pfVar19->index;
                    pfVar19 = pfVar19 + 1;
                  } while (iVar21 != -1);
                }
              }
              else {
                while (iVar21 != -1) {
                  lVar13 = (long)iVar21;
                  dVar44 = pfVar19[-1].value * dVar41 + *(double *)((long)pvVar11 + lVar13 * 8 + -8)
                  ;
                  *(double *)((long)pvVar11 + lVar13 * 8 + -8) = dVar44;
                  if (0.0 < dVar44) {
                    dVar43 = dVar43 + local_130[*(char *)((long)pvVar10 + lVar13 + -1)] * dVar44 *
                                      dVar44;
                  }
                  iVar21 = pfVar19->index;
                  pfVar19 = pfVar19 + 1;
                }
              }
              if ((dVar42 + dVar43) - local_1e8 <= 0.0) goto LAB_00106a09;
              dVar42 = dVar39 * 0.5;
              dVar38 = dVar38 * 0.5;
              uVar17 = uVar17 + 1;
              dVar41 = dVar39;
              dVar39 = dVar42;
            } while (uVar17 != 0x14);
            uVar17 = 0x14;
            goto LAB_00106a09;
          }
          if (dVar41 < 0.0) {
            dVar38 = -dVar41;
            goto LAB_0010674a;
          }
          dVar38 = dVar36;
          if (((0.0 < dVar36) || (dVar38 = 0.0, dVar41 <= local_f8)) || (dVar34 <= dVar36))
          goto LAB_0010674a;
          uVar27 = (ulong)(iVar15 - 1);
          *(undefined4 *)((long)pvVar9 + (long)iVar7 * 4) =
               *(undefined4 *)((long)pvVar9 + (long)iVar15 * 4 + -4);
          *(int *)((long)pvVar9 + (long)iVar15 * 4 + -4) = iVar21;
          iVar7 = iVar7 + -1;
          goto LAB_00106b1b;
        }
        dVar29 = 0.0;
        dVar35 = 0.0;
      }
LAB_00106b49:
      uVar1 = SUB84(dVar29,0);
      uVar6 = (int)((ulong)dVar29 >> 0x20);
      if (uVar22 != 0) {
        uVar1 = uVar31;
        uVar6 = uVar32;
      }
      uVar32 = uVar6;
      uVar31 = uVar1;
      uVar17 = uVar22 + 1;
      if ((uVar17 * -0x33333333 >> 1 | (uint)((uVar17 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a
         ) {
        local_f8 = (double)CONCAT44(uVar32,uVar31);
        info(".");
        uVar31 = SUB84(local_f8,0);
        uVar32 = (undefined4)((ulong)local_f8 >> 0x20);
      }
      if (dVar29 <= dVar33 * (double)CONCAT44(uVar32,uVar31)) {
        if ((uint)uVar27 == local_120._4_4_) goto LAB_00106c1d;
        local_f8 = (double)CONCAT44(uVar32,uVar31);
        info("*");
        uVar31 = SUB84(local_f8,0);
        uVar32 = (undefined4)((ulong)local_f8 >> 0x20);
        dVar35 = INFINITY;
        uVar27 = (ulong)(uint)local_120._4_4_;
      }
      uVar22 = uVar17;
    } while (uVar17 != 1000);
    uVar22 = 999;
    uVar17 = 1000;
LAB_00106c1d:
    info("\noptimization finished, #iter = %d\n",(ulong)uVar17);
    if (0x3e6 < uVar22) {
      info("\nWARNING: reaching max number of iterations\n");
    }
    if ((int)local_120._4_4_ < 1) {
      dVar35 = 0.0;
      uVar22 = 0;
    }
    else {
      lVar18 = 0;
      uVar22 = 0;
      dVar35 = 0.0;
      do {
        iVar7 = (*(feature_node **)(local_120._16_8_ + lVar18 * 8))->index;
        if (iVar7 != -1) {
          pdVar8 = &(*(feature_node **)(local_120._16_8_ + lVar18 * 8))->value;
          do {
            *pdVar8 = *(double *)(local_120._8_8_ + ((long)iVar7 + -1) * 8) * *pdVar8;
            iVar7 = *(int *)(pdVar8 + 1);
            pdVar8 = pdVar8 + 2;
          } while (iVar7 != -1);
        }
        dVar29 = w[lVar18];
        dVar33 = ABS(dVar29) + dVar35;
        if ((dVar29 == 0.0) && (!NAN(dVar29))) {
          dVar33 = dVar35;
        }
        dVar35 = dVar33;
        uVar22 = uVar22 + (dVar29 != 0.0);
        lVar18 = lVar18 + 1;
      } while (lVar18 != lVar24);
    }
    if (0 < (int)local_120._0_4_) {
      uVar27 = 0;
      do {
        dVar29 = *(double *)((long)pvVar11 + uVar27 * 8);
        if (0.0 < dVar29) {
          dVar35 = dVar35 + local_130[*(char *)((long)pvVar10 + uVar27)] * dVar29 * dVar29;
        }
        uVar27 = uVar27 + 1;
      } while (uVar20 != uVar27);
    }
    info("Objective value = %lf\n",dVar35);
    info("#nonzeros/#features = %d/%d\n",(ulong)uVar22,(ulong)(uint)local_120._4_4_);
    operator_delete__(pvVar9);
    operator_delete__(pvVar10);
    operator_delete__(pvVar11);
    goto LAB_00107f5c;
  case 6:
    local_b0 = (feature_node *)0x0;
    transpose(prob,&local_b0,(problem *)local_120);
    uVar27 = (ulong)(int)local_120._0_4_;
    lVar24 = (long)(int)local_120._4_4_;
    uVar20 = lVar24 * 4;
    if (lVar24 < 0) {
      uVar20 = 0xffffffffffffffff;
    }
    uVar16 = lVar24 * 8;
    if (lVar24 < 0) {
      uVar16 = 0xffffffffffffffff;
    }
    pvVar9 = operator_new__(uVar20);
    pvVar10 = operator_new__(uVar27);
    local_b8 = operator_new__(uVar16);
    pvVar11 = operator_new__(uVar16);
    __src = operator_new__(uVar16);
    local_d8 = operator_new__(uVar16);
    uVar20 = uVar27 * 8;
    if ((long)uVar27 < 0) {
      uVar20 = 0xffffffffffffffff;
    }
    __s = operator_new__(uVar20);
    __dest = operator_new__(uVar20);
    local_c0 = operator_new__(uVar20);
    local_e0 = operator_new__(uVar20);
    pvVar12 = operator_new__(uVar20);
    uVar27 = (ulong)(uint)local_120._0_4_;
    uVar20 = (ulong)(uint)local_120._4_4_;
    local_130[0] = 0.0;
    local_130[1] = local_98;
    if (0 < lVar24) {
      memset(w,0,uVar20 * 8);
    }
    pvVar28 = local_b8;
    pvVar23 = local_e0;
    if (0 < (int)local_120._0_4_) {
      uVar16 = 0;
      do {
        *(byte *)((long)pvVar10 + uVar16) = -(*(double *)(local_120._8_8_ + uVar16 * 8) <= 0.0) | 1;
        *(undefined8 *)((long)__dest + uVar16 * 8) = 0;
        uVar16 = uVar16 + 1;
      } while (uVar27 != uVar16);
    }
    if ((int)local_120._4_4_ < 1) {
      local_188 = 0.0;
    }
    else {
      local_188 = 0.0;
      uVar16 = 0;
      do {
        dVar35 = w[uVar16];
        *(double *)((long)__src + uVar16 * 8) = dVar35;
        *(int *)((long)pvVar9 + uVar16 * 4) = (int)uVar16;
        *(undefined8 *)((long)local_d8 + uVar16 * 8) = 0;
        iVar7 = (*(feature_node **)(local_120._16_8_ + uVar16 * 8))->index;
        pfVar14 = *(feature_node **)(local_120._16_8_ + uVar16 * 8);
        while (iVar7 != -1) {
          lVar18 = (long)iVar7;
          dVar29 = pfVar14->value;
          *(double *)((long)__dest + lVar18 * 8 + -8) =
               dVar35 * dVar29 + *(double *)((long)__dest + lVar18 * 8 + -8);
          if (*(char *)((long)pvVar10 + lVar18 + -1) == -1) {
            *(double *)((long)local_d8 + uVar16 * 8) =
                 dVar29 * local_a8 + *(double *)((long)local_d8 + uVar16 * 8);
          }
          iVar7 = pfVar14[1].index;
          pfVar14 = pfVar14 + 1;
        }
        local_188 = local_188 + ABS(dVar35);
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar20);
    }
    if (0 < (int)local_120._0_4_) {
      uVar16 = 0;
      do {
        dVar29 = exp(*(double *)((long)__dest + uVar16 * 8));
        *(double *)((long)__dest + uVar16 * 8) = dVar29;
        dVar34 = 1.0 / (dVar29 + 1.0);
        dVar35 = local_130[*(char *)((long)pvVar10 + uVar16)];
        *(double *)((long)pvVar23 + uVar16 * 8) = dVar34 * dVar35;
        *(double *)((long)pvVar12 + uVar16 * 8) = dVar29 * dVar35 * dVar34 * dVar34;
        uVar16 = uVar16 + 1;
      } while (uVar27 != uVar16);
    }
    uVar5 = local_120._16_8_;
    local_78 = (double)(int)local_120._0_4_;
    local_d0 = uVar27 * 8;
    local_50 = uVar20 * 8;
    uVar31 = 0;
    uVar32 = 0x7ff00000;
    local_174 = 0;
    local_c8 = 1.0;
    auVar30 = ZEXT816(0xbff0000000000000);
    local_70 = pvVar9;
LAB_00107362:
    dVar35 = 0.0;
    local_1b0 = 0.0;
    uVar22 = local_120._4_4_;
    if (0 < (int)local_120._4_4_) {
      dVar35 = 0.0;
      local_1b0 = 0.0;
      iVar7 = 0;
      do {
        iVar21 = *(int *)((long)pvVar9 + (long)iVar7 * 4);
        lVar18 = (long)iVar21;
        *(undefined8 *)((long)pvVar28 + lVar18 * 8) = 0x3d719799812dea11;
        *(undefined8 *)((long)pvVar11 + lVar18 * 8) = 0;
        iVar26 = (*(feature_node **)(uVar5 + lVar18 * 8))->index;
        dVar29 = 0.0;
        if (iVar26 != -1) {
          pdVar8 = &(*(feature_node **)(uVar5 + lVar18 * 8))->value;
          dVar34 = 1e-12;
          do {
            dVar34 = dVar34 + *pdVar8 * *pdVar8 * *(double *)((long)pvVar12 + (long)iVar26 * 8 + -8)
            ;
            *(double *)((long)pvVar28 + lVar18 * 8) = dVar34;
            dVar29 = dVar29 + *pdVar8 * *(double *)((long)pvVar23 + (long)iVar26 * 8 + -8);
            iVar26 = *(int *)(pdVar8 + 1);
            pdVar8 = pdVar8 + 2;
          } while (iVar26 != -1);
        }
        dVar29 = *(double *)((long)local_d8 + lVar18 * 8) - dVar29;
        *(double *)((long)pvVar11 + lVar18 * 8) = dVar29;
        dVar39 = dVar29 + 1.0;
        dVar29 = dVar29 + -1.0;
        dVar34 = w[lVar18];
        if ((dVar34 != 0.0) || (NAN(dVar34))) {
          if (dVar34 <= 0.0) {
            dVar34 = ABS(dVar29);
          }
          else {
            dVar34 = ABS(dVar39);
          }
LAB_001074b1:
          if (local_1b0 <= dVar34) {
            local_1b0 = dVar34;
          }
          dVar35 = dVar35 + dVar34;
          iVar7 = iVar7 + 1;
        }
        else {
          if (dVar39 < 0.0) {
            dVar34 = -dVar39;
            goto LAB_001074b1;
          }
          dVar34 = dVar29;
          if (((0.0 < dVar29) ||
              (dVar34 = 0.0, dVar39 <= (double)CONCAT44(uVar32,uVar31) / local_78)) ||
             (-(double)CONCAT44(uVar32,uVar31) / local_78 <= dVar29)) goto LAB_001074b1;
          lVar18 = (long)(int)uVar22;
          uVar22 = uVar22 - 1;
          *(undefined4 *)((long)pvVar9 + (long)iVar7 * 4) =
               *(undefined4 *)((long)pvVar9 + lVar18 * 4 + -4);
          *(int *)((long)pvVar9 + lVar18 * 4 + -4) = iVar21;
        }
      } while (iVar7 < (int)uVar22);
    }
    uVar31 = SUB84(dVar35,0);
    uVar32 = (undefined4)((ulong)dVar35 >> 0x20);
    if (local_174 != 0) {
      uVar31 = auVar30._0_4_;
      uVar32 = auVar30._4_4_;
    }
    if (dVar33 * (double)CONCAT44(uVar32,uVar31) < dVar35) {
      local_80 = CONCAT44(uVar32,uVar31);
      if (0 < (int)local_120._0_4_) {
        memset(__s,0,local_d0);
        uVar31 = (undefined4)local_80;
        uVar32 = (undefined4)(local_80 >> 0x20);
      }
      dVar29 = local_c8 * (double)CONCAT44(uVar32,uVar31);
      dVar35 = 0.0;
      uVar16 = (ulong)uVar22;
      local_1a8 = INFINITY;
      do {
        local_1e8 = 0.0;
        local_f8 = dVar35;
        if ((int)uVar16 < 1) {
          local_1a8 = 0.0;
        }
        else {
          lVar18 = 0;
          uVar25 = uVar16;
          do {
            iVar7 = rand();
            lVar13 = iVar7 % (int)uVar25 + lVar18;
            uVar31 = *(undefined4 *)((long)pvVar9 + lVar13 * 4);
            *(undefined4 *)((long)pvVar9 + lVar13 * 4) = *(undefined4 *)((long)pvVar9 + lVar18 * 4);
            *(undefined4 *)((long)pvVar9 + lVar18 * 4) = uVar31;
            lVar18 = lVar18 + 1;
            uVar25 = uVar25 - 1;
          } while (uVar25 != 0);
          if ((int)uVar16 < 1) {
            local_1a8 = 0.0;
          }
          else {
            dVar34 = local_1a8 / local_78;
            dVar35 = -local_1a8;
            local_1a8 = 0.0;
            iVar7 = 0;
            local_1e8 = 0.0;
            do {
              iVar21 = *(int *)((long)pvVar9 + (long)iVar7 * 4);
              lVar18 = (long)iVar21;
              pfVar14 = *(feature_node **)(uVar5 + lVar18 * 8);
              dVar39 = *(double *)((long)__src + lVar18 * 8);
              dVar40 = (dVar39 - w[lVar18]) * 1e-12 + *(double *)((long)pvVar11 + lVar18 * 8);
              iVar26 = pfVar14->index;
              pfVar19 = pfVar14;
              iVar2 = iVar26;
              while (iVar2 != -1) {
                dVar40 = dVar40 + pfVar19->value * *(double *)((long)pvVar12 + (long)iVar2 * 8 + -8)
                                  * *(double *)((long)__s + (long)iVar2 * 8 + -8);
                iVar2 = pfVar19[1].index;
                pfVar19 = pfVar19 + 1;
              }
              dVar37 = *(double *)((long)local_b8 + lVar18 * 8);
              dVar36 = dVar40 + 1.0;
              dVar40 = dVar40 + -1.0;
              if ((dVar39 != 0.0) || (NAN(dVar39))) {
                dVar41 = dVar40;
                if (0.0 < dVar39) {
                  dVar41 = dVar36;
                }
                dVar41 = ABS(dVar41);
LAB_0010772e:
                if (dVar37 * dVar39 <= dVar36) {
                  if (dVar40 <= dVar37 * dVar39) {
                    dVar37 = -dVar39;
                  }
                  else {
                    dVar37 = -dVar40 / dVar37;
                  }
                }
                else {
                  dVar37 = -dVar36 / dVar37;
                }
                if (local_1a8 <= dVar41) {
                  local_1a8 = dVar41;
                }
                local_1e8 = local_1e8 + dVar41;
                if (1e-12 <= ABS(dVar37)) {
                  if (dVar37 <= -10.0) {
                    dVar37 = -10.0;
                  }
                  if (10.0 <= dVar37) {
                    dVar37 = 10.0;
                  }
                  *(double *)((long)__src + lVar18 * 8) = dVar39 + dVar37;
                  while (iVar26 != -1) {
                    *(double *)((long)__s + (long)iVar26 * 8 + -8) =
                         pfVar14->value * dVar37 + *(double *)((long)__s + (long)iVar26 * 8 + -8);
                    iVar26 = pfVar14[1].index;
                    pfVar14 = pfVar14 + 1;
                  }
                }
              }
              else {
                if (dVar36 < 0.0) {
                  dVar41 = -dVar36;
                  goto LAB_0010772e;
                }
                dVar41 = dVar40;
                if (((0.0 < dVar40) || (dVar41 = 0.0, dVar36 <= dVar34)) ||
                   (dVar35 / local_78 <= dVar40)) goto LAB_0010772e;
                iVar26 = (int)uVar16;
                uVar16 = (ulong)(iVar26 - 1);
                *(undefined4 *)((long)pvVar9 + (long)iVar7 * 4) =
                     *(undefined4 *)((long)pvVar9 + (long)iVar26 * 4 + -4);
                *(int *)((long)pvVar9 + (long)iVar26 * 4 + -4) = iVar21;
                iVar7 = iVar7 + -1;
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 < (int)uVar16);
          }
        }
        local_14c = SUB84(local_f8,0) + 1;
        dVar35 = (double)(ulong)local_14c;
        if (local_1e8 <= dVar29) {
          local_1a8 = INFINITY;
          uVar17 = (uint)uVar16;
          uVar16 = (ulong)uVar22;
          if (uVar17 == uVar22) goto LAB_00107869;
        }
      } while (local_14c != 1000);
      local_f8 = 4.93571580195405e-321;
      local_14c = 1000;
LAB_00107869:
      if (0x3e6 < SUB84(local_f8,0)) {
        info("WARNING: reaching max number of inner iterations\n");
      }
      dVar29 = 0.0;
      dVar34 = 0.0;
      uStack_60 = 0;
      dVar35 = 0.0;
      if (0 < (int)local_120._4_4_) {
        dVar35 = 0.0;
        uVar16 = 0;
        do {
          dVar39 = *(double *)((long)__src + uVar16 * 8);
          dVar34 = dVar34 + (dVar39 - w[uVar16]) * *(double *)((long)pvVar11 + uVar16 * 8);
          dVar35 = (double)(~-(ulong)(dVar39 != 0.0) & (ulong)dVar35 |
                           (ulong)(ABS(dVar39) + dVar35) & -(ulong)(dVar39 != 0.0));
          uVar16 = uVar16 + 1;
        } while (uVar20 != uVar16);
      }
      if (0 < (int)local_120._0_4_) {
        dVar29 = 0.0;
        uVar16 = 0;
        do {
          if (*(char *)((long)pvVar10 + uVar16) == -1) {
            dVar29 = dVar29 + *(double *)((long)__s + uVar16 * 8) * local_a8;
          }
          uVar16 = uVar16 + 1;
        } while (uVar27 != uVar16);
      }
      dVar34 = dVar34 + (dVar35 - local_188);
      uVar22 = 0;
LAB_0010795d:
      pvVar9 = local_c0;
      uStack_40 = 0;
      dVar39 = dVar34 * -0.01 + (dVar35 - local_188) + dVar29;
      local_68 = dVar34;
      local_48 = dVar35;
      if (0 < (int)local_120._0_4_) {
        uVar16 = 0;
        do {
          dVar40 = exp(*(double *)((long)__s + uVar16 * 8));
          dVar34 = *(double *)((long)__dest + uVar16 * 8) * dVar40;
          *(double *)((long)pvVar9 + uVar16 * 8) = dVar34;
          dVar35 = local_130[*(char *)((long)pvVar10 + uVar16)];
          dVar34 = log((dVar34 + 1.0) / (dVar40 + dVar34));
          dVar39 = dVar39 + dVar34 * dVar35;
          uVar16 = uVar16 + 1;
        } while (uVar27 != uVar16);
      }
      pvVar9 = local_70;
      pvVar23 = local_e0;
      if (0.0 < dVar39) goto code_r0x00107a3f;
      if (0 < (int)local_120._4_4_) {
        memcpy(w,__src,local_50);
      }
      pvVar28 = local_c0;
      if (0 < (int)local_120._0_4_) {
        memcpy(__dest,local_c0,local_d0);
        uVar16 = 0;
        do {
          dVar35 = *(double *)((long)pvVar28 + uVar16 * 8);
          dVar34 = 1.0 / (dVar35 + 1.0);
          dVar29 = local_130[*(char *)((long)pvVar10 + uVar16)];
          *(double *)((long)pvVar23 + uVar16 * 8) = dVar34 * dVar29;
          *(double *)((long)pvVar12 + uVar16 * 8) = dVar35 * dVar29 * dVar34 * dVar34;
          uVar16 = uVar16 + 1;
        } while (uVar27 != uVar16);
      }
      local_188 = local_48;
      goto LAB_00107bfe;
    }
    goto LAB_00107d86;
  case 7:
    solve_l2r_lr_dual(prob,w,dVar35,Cp,Cn);
    return;
  case 0xb:
    uVar20 = 0xffffffffffffffff;
    if (-1 < iVar7) {
      uVar20 = lVar24 << 3;
    }
    pdVar8 = (double *)operator_new__(uVar20);
    if (0 < iVar7) {
      dVar35 = param->C;
      lVar18 = 0;
      do {
        pdVar8[lVar18] = dVar35;
        lVar18 = lVar18 + 1;
      } while (lVar24 != lVar18);
    }
    this = (l2r_l2_svr_fun *)operator_new(0x48);
    l2r_l2_svr_fun::l2r_l2_svr_fun(this,prob,pdVar8,param->p);
    TRON::TRON((TRON *)local_120,(function *)this,param->eps,0.1,1000);
    TRON::set_print_string((TRON *)local_120,liblinear_print_string);
    TRON::tron((TRON *)local_120,w);
    (*(this->super_l2r_l2_svc_fun).super_function._vptr_function[5])(this);
    goto LAB_00106e9f;
  case 0xc:
    iVar7 = 0xc;
    goto LAB_00107189;
  case 0xd:
    iVar7 = 0xd;
LAB_00107189:
    solve_l2r_l1l2_svr(prob,w,param,iVar7);
    return;
  }
  (*(this_00->super_function)._vptr_function[5])(this_00);
LAB_00106e9f:
  operator_delete__(pdVar8);
  TRON::~TRON((TRON *)local_120);
  return;
code_r0x00107a3f:
  if ((int)local_120._4_4_ < 1) {
    dVar35 = 0.0;
  }
  else {
    dVar35 = 0.0;
    uVar16 = 0;
    do {
      dVar34 = (w[uVar16] + *(double *)((long)__src + uVar16 * 8)) * 0.5;
      *(double *)((long)__src + uVar16 * 8) = dVar34;
      dVar35 = (double)(~-(ulong)(dVar34 != 0.0) & (ulong)dVar35 |
                       (ulong)(ABS(dVar34) + dVar35) & -(ulong)(dVar34 != 0.0));
      uVar16 = uVar16 + 1;
    } while (uVar20 != uVar16);
  }
  if (0 < (int)local_120._0_4_) {
    uVar16 = 0;
    do {
      *(double *)((long)__s + uVar16 * 8) = *(double *)((long)__s + uVar16 * 8) * 0.5;
      uVar16 = uVar16 + 1;
    } while (uVar27 != uVar16);
  }
  dVar34 = local_68 * 0.5;
  dVar29 = dVar29 * 0.5;
  uVar22 = uVar22 + 1;
  if (uVar22 == 0x14) goto code_r0x00107b2b;
  goto LAB_0010795d;
code_r0x00107b2b:
  uVar22 = 0x14;
LAB_00107bfe:
  if (0x13 < uVar22) {
    if (0 < (int)local_120._0_4_) {
      memset(__dest,0,local_d0);
    }
    if (0 < (int)local_120._4_4_) {
      uVar16 = 0;
      do {
        dVar35 = w[uVar16];
        if ((dVar35 != 0.0) || (NAN(dVar35))) {
          iVar7 = (*(feature_node **)(uVar5 + uVar16 * 8))->index;
          pfVar14 = *(feature_node **)(uVar5 + uVar16 * 8);
          while (iVar7 != -1) {
            *(double *)((long)__dest + (long)iVar7 * 8 + -8) =
                 pfVar14->value * dVar35 + *(double *)((long)__dest + (long)iVar7 * 8 + -8);
            iVar7 = pfVar14[1].index;
            pfVar14 = pfVar14 + 1;
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar20);
    }
    if (0 < (int)local_120._0_4_) {
      uVar16 = 0;
      do {
        dVar35 = exp(*(double *)((long)__dest + uVar16 * 8));
        *(double *)((long)__dest + uVar16 * 8) = dVar35;
        uVar16 = uVar16 + 1;
      } while (uVar27 != uVar16);
    }
  }
  dVar35 = local_c8 * 0.25;
  if (local_f8._0_4_ != 0) {
    dVar35 = local_c8;
  }
  local_174 = local_174 + 1;
  info("iter %3d  #CD cycles %d\n",(ulong)local_174,(ulong)local_14c);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_80;
  uVar31 = SUB84(local_1b0,0);
  uVar32 = (undefined4)((ulong)local_1b0 >> 0x20);
  pvVar23 = local_e0;
  pvVar28 = local_b8;
  local_c8 = dVar35;
  if (local_174 == 100) goto code_r0x00107d80;
  goto LAB_00107362;
joined_r0x001069b4:
  while (iVar2 != -1) {
    *(double *)((long)pvVar11 + (long)iVar2 * 8 + -8) =
         pfVar14[-1].value * dVar41 + *(double *)((long)pvVar11 + (long)iVar2 * 8 + -8);
    piVar4 = &pfVar14->index;
    pfVar14 = pfVar14 + 1;
    iVar2 = *piVar4;
  }
LAB_00106a09:
  w[lVar18] = dVar37 + dVar39;
  if (0x13 < uVar17) {
    info("#");
    if (0 < (int)local_120._0_4_) {
      uVar16 = 0;
      do {
        *(undefined8 *)((long)pvVar11 + uVar16 * 8) = 0x3ff0000000000000;
        uVar16 = uVar16 + 1;
      } while (uVar20 != uVar16);
    }
    if (0 < (int)local_120._4_4_) {
      lVar18 = 0;
      do {
        dVar39 = w[lVar18];
        if ((dVar39 != 0.0) || (NAN(dVar39))) {
          pfVar14 = *(feature_node **)(uVar5 + lVar18 * 8);
          iVar21 = pfVar14->index;
          if (iVar21 != -1) {
            do {
              *(double *)((long)pvVar11 + (long)iVar21 * 8 + -8) =
                   pfVar14->value * -dVar39 + *(double *)((long)pvVar11 + (long)iVar21 * 8 + -8);
              iVar21 = pfVar14[1].index;
              pfVar14 = pfVar14 + 1;
            } while (iVar21 != -1);
          }
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != lVar24);
    }
  }
LAB_00106b1b:
  iVar7 = iVar7 + 1;
  if ((int)uVar27 <= iVar7) goto LAB_00106b49;
  goto LAB_00106635;
code_r0x00107d80:
  local_174 = 100;
LAB_00107d86:
  info("=========================\n");
  info("optimization finished, #iter = %d\n",(ulong)local_174);
  if (99 < local_174) {
    info("WARNING: reaching max number of iterations\n");
  }
  if ((int)local_120._4_4_ < 1) {
    dVar35 = 0.0;
    uVar22 = 0;
  }
  else {
    uVar16 = 0;
    uVar22 = 0;
    uVar31 = 0;
    uVar32 = 0;
    do {
      dVar29 = w[uVar16];
      dVar35 = ABS(dVar29) + (double)CONCAT44(uVar32,uVar31);
      if ((dVar29 == 0.0) && (!NAN(dVar29))) {
        dVar35 = (double)CONCAT44(uVar32,uVar31);
      }
      uVar22 = uVar22 + (dVar29 != 0.0);
      uVar16 = uVar16 + 1;
      uVar31 = SUB84(dVar35,0);
      uVar32 = (undefined4)((ulong)dVar35 >> 0x20);
    } while (uVar20 != uVar16);
  }
  if (0 < (int)local_120._0_4_) {
    uVar20 = 0;
    do {
      if ((long)*(char *)((long)pvVar10 + uVar20) == 1) {
        dVar29 = 1.0 / *(double *)((long)__dest + uVar20 * 8);
        local_1a8 = local_98;
      }
      else {
        local_1a8 = local_130[*(char *)((long)pvVar10 + uVar20)];
        dVar29 = *(double *)((long)__dest + uVar20 * 8);
      }
      dVar29 = log(dVar29 + 1.0);
      dVar35 = dVar35 + dVar29 * local_1a8;
      uVar20 = uVar20 + 1;
    } while (uVar27 != uVar20);
  }
  info("Objective value = %lf\n",dVar35);
  info("#nonzeros/#features = %d/%d\n",(ulong)uVar22,lVar24);
  operator_delete__(pvVar9);
  operator_delete__(pvVar10);
  operator_delete__(pvVar28);
  operator_delete__(pvVar11);
  operator_delete__(__src);
  operator_delete__(local_d8);
  operator_delete__(__s);
  operator_delete__(__dest);
  operator_delete__(local_c0);
  operator_delete__(local_e0);
LAB_00107f5c:
  operator_delete__(pvVar12);
  if ((double *)local_120._8_8_ != (double *)0x0) {
    operator_delete__((void *)local_120._8_8_);
  }
  if ((feature_node **)local_120._16_8_ != (feature_node **)0x0) {
    operator_delete__((void *)local_120._16_8_);
  }
  if (local_b0 == (feature_node *)0x0) {
    return;
  }
  operator_delete__(local_b0);
  return;
}

Assistant:

static void train_one(const problem *prob, const parameter *param, double *w, double Cp, double Cn)
{
	//inner and outer tolerances for TRON
	double eps = param->eps;
	double eps_cg = 0.1;
	if(param->init_sol != NULL)
		eps_cg = 0.5;

	int pos = 0;
	int neg = 0;
	for(int i=0;i<prob->l;i++)
		if(prob->y[i] > 0)
			pos++;
	neg = prob->l - pos;
	double primal_solver_tol = eps*max(min(pos,neg), 1)/prob->l;

	function *fun_obj=NULL;
	switch(param->solver_type)
	{
		case L2R_LR:
		{
			double *C = new double[prob->l];
			for(int i = 0; i < prob->l; i++)
			{
				if(prob->y[i] > 0)
					C[i] = Cp;
				else
					C[i] = Cn;
			}
			fun_obj=new l2r_lr_fun(prob, C);
			TRON tron_obj(fun_obj, primal_solver_tol, eps_cg);
			tron_obj.set_print_string(liblinear_print_string);
			tron_obj.tron(w);
			delete fun_obj;
			delete[] C;
			break;
		}
		case L2R_L2LOSS_SVC:
		{
			double *C = new double[prob->l];
			for(int i = 0; i < prob->l; i++)
			{
				if(prob->y[i] > 0)
					C[i] = Cp;
				else
					C[i] = Cn;
			}
			fun_obj=new l2r_l2_svc_fun(prob, C);
			TRON tron_obj(fun_obj, primal_solver_tol, eps_cg);
			tron_obj.set_print_string(liblinear_print_string);
			tron_obj.tron(w);
			delete fun_obj;
			delete[] C;
			break;
		}
		case L2R_L2LOSS_SVC_DUAL:
			solve_l2r_l1l2_svc(prob, w, eps, Cp, Cn, L2R_L2LOSS_SVC_DUAL);
			break;
		case L2R_L1LOSS_SVC_DUAL:
			solve_l2r_l1l2_svc(prob, w, eps, Cp, Cn, L2R_L1LOSS_SVC_DUAL);
			break;
		case L1R_L2LOSS_SVC:
		{
			problem prob_col;
			feature_node *x_space = NULL;
			transpose(prob, &x_space ,&prob_col);
			solve_l1r_l2_svc(&prob_col, w, primal_solver_tol, Cp, Cn);
			delete [] prob_col.y;
			delete [] prob_col.x;
			delete [] x_space;
			break;
		}
		case L1R_LR:
		{
			problem prob_col;
			feature_node *x_space = NULL;
			transpose(prob, &x_space ,&prob_col);
			solve_l1r_lr(&prob_col, w, primal_solver_tol, Cp, Cn);
			delete [] prob_col.y;
			delete [] prob_col.x;
			delete [] x_space;
			break;
		}
		case L2R_LR_DUAL:
			solve_l2r_lr_dual(prob, w, eps, Cp, Cn);
			break;
		case L2R_L2LOSS_SVR:
		{
			double *C = new double[prob->l];
			for(int i = 0; i < prob->l; i++)
				C[i] = param->C;

			fun_obj=new l2r_l2_svr_fun(prob, C, param->p);
			TRON tron_obj(fun_obj, param->eps);
			tron_obj.set_print_string(liblinear_print_string);
			tron_obj.tron(w);
			delete fun_obj;
			delete[] C;
			break;

		}
		case L2R_L1LOSS_SVR_DUAL:
			solve_l2r_l1l2_svr(prob, w, param, L2R_L1LOSS_SVR_DUAL);
			break;
		case L2R_L2LOSS_SVR_DUAL:
			solve_l2r_l1l2_svr(prob, w, param, L2R_L2LOSS_SVR_DUAL);
			break;
		default:
			fprintf(stderr, "ERROR: unknown solver_type\n");
			break;
	}
}